

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  VecAccess *this_00;
  VecAccess *this_01;
  int iVar1;
  value_type vVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  FragmentPacket *packet_00;
  long lVar7;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_02;
  float fVar8;
  float fVar9;
  Vector<float,_4> *local_330;
  int local_320;
  int fragNdx_1;
  Vector<float,_4> local_30c;
  Vector<float,_4> local_2fc;
  int local_2ec;
  undefined1 auStack_2e8 [4];
  int fragNdx;
  VecAccess<float,_3,_2> local_2d8;
  VecAccess<float,_3,_2> local_2c8;
  VecAccess<float,_3,_2> local_2b8;
  Vec2 local_2a8;
  Vec2 coords2D [4];
  tcu local_278 [16];
  VecAccess<float,_4,_3> local_268;
  Vector<float,_4> local_250;
  tcu local_240 [16];
  VecAccess<float,_4,_3> local_230;
  Vector<float,_4> local_218;
  tcu local_208 [16];
  VecAccess<float,_4,_3> local_1f8;
  Vector<float,_4> local_1e0;
  tcu local_1d0 [16];
  VecAccess<float,_4,_3> local_1c0;
  undefined1 local_1a8 [8];
  Vec3 coords3D [4];
  rr local_158 [16];
  VecAccess<float,_4,_2> local_148;
  rr local_138 [16];
  VecAccess<float,_4,_2> local_128;
  rr local_118 [16];
  VecAccess<float,_4,_2> local_108;
  VecAccess local_f8 [8];
  Vec2 texCoords [4];
  Vec4 texSamples [4];
  int local_8c;
  undefined1 local_88 [4];
  int unitNdx;
  Vec4 outColors [4];
  float colorMultiplier;
  FragmentPacket *packet;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  MultiTexShader *this_local;
  
  for (packet._4_4_ = 0; packet._4_4_ < numPackets; packet._4_4_ = packet._4_4_ + 1) {
    packet_00 = packets + packet._4_4_;
    iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_88,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(outColors[0].m_data + 2),0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(outColors[1].m_data + 2),0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(outColors[2].m_data + 2),0.0);
    for (local_8c = 0; local_8c < *(int *)&(this->super_ShaderProgram).field_0x154;
        local_8c = local_8c + 1) {
      local_330 = (Vector<float,_4> *)(texCoords + 3);
      do {
        tcu::Vector<float,_4>::Vector(local_330);
        local_330 = local_330 + 1;
      } while (local_330 != (Vector<float,_4> *)(texSamples[3].m_data + 2));
      rr::readTriangleVarying<float>(local_118,packet_00,context,0,0);
      local_108 = tcu::Vector<float,_4>::xy((Vector<float,_4> *)local_118);
      tcu::VecAccess::operator_cast_to_Vector(local_f8);
      rr::readTriangleVarying<float>(local_138,packet_00,context,0,1);
      local_128 = tcu::Vector<float,_4>::xy((Vector<float,_4> *)local_138);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)texCoords);
      this_00 = (VecAccess *)(texCoords + 1);
      rr::readTriangleVarying<float>(local_158,packet_00,context,0,2);
      local_148 = tcu::Vector<float,_4>::xy((Vector<float,_4> *)local_158);
      tcu::VecAccess::operator_cast_to_Vector(this_00);
      this_01 = (VecAccess *)(texCoords + 2);
      rr::readTriangleVarying<float>((rr *)(coords3D[3].m_data + 1),packet_00,context,0,3);
      tcu::Vector<float,_4>::xy((Vector<float,_4> *)(coords3D[3].m_data + 1));
      tcu::VecAccess::operator_cast_to_Vector(this_01);
      this_02 = &this->m_transformations;
      pvVar3 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
               operator[](this_02,(long)local_8c);
      fVar8 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_f8);
      fVar9 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_f8);
      tcu::Vector<float,_4>::Vector(&local_1e0,fVar8,fVar9,1.0,1.0);
      tcu::operator*(local_1d0,pvVar3,&local_1e0);
      tcu::Vector<float,_4>::xyz(&local_1c0,(Vector<float,_4> *)local_1d0);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)local_1a8);
      pvVar3 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
               operator[](this_02,(long)local_8c);
      fVar8 = tcu::Vector<float,_2>::x((Vector<float,_2> *)texCoords);
      fVar9 = tcu::Vector<float,_2>::y((Vector<float,_2> *)texCoords);
      tcu::Vector<float,_4>::Vector(&local_218,fVar8,fVar9,1.0,1.0);
      tcu::operator*(local_208,pvVar3,&local_218);
      tcu::Vector<float,_4>::xyz(&local_1f8,(Vector<float,_4> *)local_208);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords3D[0].m_data + 1));
      pvVar3 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
               operator[](this_02,(long)local_8c);
      fVar8 = tcu::Vector<float,_2>::x((Vector<float,_2> *)this_00);
      fVar9 = tcu::Vector<float,_2>::y((Vector<float,_2> *)this_00);
      tcu::Vector<float,_4>::Vector(&local_250,fVar8,fVar9,1.0,1.0);
      tcu::operator*(local_240,pvVar3,&local_250);
      tcu::Vector<float,_4>::xyz(&local_230,(Vector<float,_4> *)local_240);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords3D[1].m_data + 1));
      pvVar3 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
               operator[](this_02,(long)local_8c);
      fVar8 = tcu::Vector<float,_2>::x((Vector<float,_2> *)this_01);
      fVar9 = tcu::Vector<float,_2>::y((Vector<float,_2> *)this_01);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(coords2D + 3),fVar8,fVar9,1.0,1.0);
      tcu::operator*(local_278,pvVar3,(Vector<float,_4> *)(coords2D + 3));
      tcu::Vector<float,_4>::xyz(&local_268,(Vector<float,_4> *)local_278);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords3D[2].m_data + 1));
      local_2b8 = tcu::Vector<float,_3>::xy((Vector<float,_3> *)local_1a8);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_2a8);
      local_2c8 = tcu::Vector<float,_3>::xy((Vector<float,_3> *)(coords3D[0].m_data + 1));
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)coords2D);
      local_2d8 = tcu::Vector<float,_3>::xy((Vector<float,_3> *)(coords3D[1].m_data + 1));
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords2D + 1));
      _auStack_2e8 = tcu::Vector<float,_3>::xy((Vector<float,_3> *)(coords3D[2].m_data + 1));
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(coords2D + 2));
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_unitTypes,(long)local_8c);
      vVar2 = *pvVar4;
      if (vVar2 == 0xde1) {
        pvVar5 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                           (&(this->super_ShaderProgram).m_uniforms,(long)(local_8c << 2));
        sglr::rc::Texture2D::sample4((pvVar5->sampler).tex2D,(Vec4 *)(texCoords + 3),&local_2a8,0.0)
        ;
      }
      else if (vVar2 == 0x806f) {
        pvVar5 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                           (&(this->super_ShaderProgram).m_uniforms,(long)(local_8c << 2));
        sglr::rc::Texture3D::sample4
                  ((pvVar5->sampler).tex3D,(Vec4 *)(texCoords + 3),(Vec3 *)local_1a8,0.0);
      }
      else if (vVar2 == 0x8513) {
        pvVar5 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                           (&(this->super_ShaderProgram).m_uniforms,(long)(local_8c << 2));
        sglr::rc::TextureCube::sample4
                  ((pvVar5->sampler).texCube,(Vec4 *)(texCoords + 3),(Vec3 *)local_1a8,0.0);
      }
      else if (vVar2 == 0x8c1a) {
        pvVar5 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                           (&(this->super_ShaderProgram).m_uniforms,(long)(local_8c << 2));
        sglr::rc::Texture2DArray::sample4
                  ((pvVar5->sampler).tex2DArray,(Vec4 *)(texCoords + 3),(Vec3 *)local_1a8,0.0);
      }
      for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
        lVar7 = (long)local_2ec;
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](&this->m_texScales,(long)local_8c);
        tcu::operator*((tcu *)&stack0xfffffffffffffce4,
                       (Vector<float,_4> *)(texSamples[lVar7 + -1].m_data + 2),pvVar6);
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](&this->m_texBiases,(long)local_8c);
        tcu::operator+((tcu *)&local_30c,(Vector<float,_4> *)&stack0xfffffffffffffce4,pvVar6);
        tcu::operator*((tcu *)&local_2fc,1.0 / (float)iVar1,&local_30c);
        tcu::Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)(local_88 + (long)local_2ec * 0x10),&local_2fc);
      }
    }
    for (local_320 = 0; local_320 < 4; local_320 = local_320 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                (context,packet._4_4_,local_320,0,
                 (Vector<float,_4> *)(local_88 + (long)local_320 * 0x10));
    }
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			// Transform
			tcu::Vec3 coords3D[4] =
			{
				(m_transformations[unitNdx] * Vec4(texCoords[0].x(), texCoords[0].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[1].x(), texCoords[1].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[2].x(), texCoords[2].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[3].x(), texCoords[3].y(), 1.0f, 1.0f)).xyz(),
			};

			// To 2D
			const tcu::Vec2 coords2D[4] =
			{
				coords3D[0].xy(),
				coords3D[1].xy(),
				coords3D[2].xy(),
				coords3D[3].xy(),
			};

			// Sample
			switch (m_unitTypes[unitNdx])
			{
				case GL_TEXTURE_2D:			m_uniforms[4*unitNdx].sampler.tex2D->sample4(texSamples, coords2D);			break;
				case GL_TEXTURE_CUBE_MAP:	m_uniforms[4*unitNdx].sampler.texCube->sample4(texSamples, coords3D);		break;
				case GL_TEXTURE_2D_ARRAY:	m_uniforms[4*unitNdx].sampler.tex2DArray->sample4(texSamples, coords3D);	break;
				case GL_TEXTURE_3D:			m_uniforms[4*unitNdx].sampler.tex3D->sample4(texSamples, coords3D);			break;
				default:
					DE_ASSERT(DE_FALSE);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * (texSamples[fragNdx]*m_texScales[unitNdx] + m_texBiases[unitNdx]);
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}